

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_compressContinue_internal
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,U32 frame,
                 U32 lastFrameChunk)

{
  ZSTD_matchState_t *ms;
  seqStore_t *origSeqStore;
  U32 *pUVar1;
  seqStore_t *resultSeqStore;
  seqStore_t *resultSeqStore_00;
  BYTE BVar2;
  U32 UVar3;
  ZSTD_paramSwitch_e ZVar4;
  ZSTD_strategy ZVar5;
  BYTE *pBVar6;
  BYTE *pBVar7;
  ZSTD_compressedBlockState_t *pZVar8;
  seqDef *psVar9;
  ushort uVar10;
  ulong uVar11;
  size_t sVar12;
  U32 UVar13;
  int iVar14;
  int iVar15;
  size_t err_code;
  size_t sVar16;
  size_t sVar17;
  size_t sVar18;
  unsigned_long_long uVar19;
  byte bVar20;
  short sVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  BYTE *pBVar27;
  ulong uVar28;
  seqStore_t *psVar29;
  ulong uVar30;
  seqStore_t *psVar31;
  BYTE *ip;
  long lVar32;
  long lVar33;
  size_t err_code_1;
  ulong uVar34;
  bool bVar35;
  byte bVar36;
  ulong local_120;
  BYTE *op;
  size_t local_110;
  repcodes_t dRep;
  undefined4 uStack_e4;
  BYTE *local_78;
  BYTE *local_70;
  size_t local_68;
  long local_60;
  repcodes_t local_58;
  size_t local_48;
  ZSTD_cwksp *local_40;
  BYTE *local_38;
  
  bVar36 = 0;
  if (cctx->stage == ZSTDcs_created) {
    local_110 = 0xffffffffffffffc4;
  }
  else {
    if (cctx->stage == ZSTDcs_init && frame != 0) {
      sVar16 = ZSTD_writeFrameHeader
                         (dst,dstCapacity,&cctx->appliedParams,cctx->pledgedSrcSizePlusOne - 1,
                          cctx->dictID);
      if (0xffffffffffffff88 < sVar16) {
        return sVar16;
      }
      bVar35 = dstCapacity < sVar16;
      dstCapacity = dstCapacity - sVar16;
      if (bVar35) {
        __assert_fail("fhSize <= dstCapacity",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x11ed,
                      "size_t ZSTD_compressContinue_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                     );
      }
      dst = (void *)((long)dst + sVar16);
      cctx->stage = ZSTDcs_ongoing;
    }
    else {
      sVar16 = 0;
    }
    if (srcSize == 0) {
      return sVar16;
    }
    pBVar27 = (cctx->blockState).matchState.window.base;
    if (pBVar27 == (BYTE *)0x0) {
LAB_001b88f5:
      __assert_fail("window->base != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x4ea,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)");
    }
    if ((cctx->blockState).matchState.window.dictBase == (BYTE *)0x0) {
LAB_001b8914:
      __assert_fail("window->dictBase != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x4eb,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)");
    }
    ms = &(cctx->blockState).matchState;
    pBVar6 = (ms->window).nextSrc;
    bVar35 = (cctx->blockState).matchState.forceNonContiguous != 0;
    if (bVar35 || pBVar6 != (BYTE *)src) {
      uVar25 = (long)pBVar6 - (long)pBVar27;
      UVar3 = (cctx->blockState).matchState.window.dictLimit;
      (cctx->blockState).matchState.window.lowLimit = UVar3;
      if (uVar25 >> 0x20 != 0) goto LAB_001b8952;
      UVar13 = (U32)uVar25;
      (cctx->blockState).matchState.window.dictLimit = UVar13;
      (cctx->blockState).matchState.window.dictBase = pBVar27;
      (cctx->blockState).matchState.window.base = (BYTE *)((long)src - uVar25);
      if (UVar13 - UVar3 < 8) {
        (cctx->blockState).matchState.window.lowLimit = UVar13;
      }
    }
    pBVar27 = (BYTE *)((long)src + srcSize);
    (cctx->blockState).matchState.window.nextSrc = pBVar27;
    pBVar7 = (cctx->blockState).matchState.window.dictBase;
    uVar22 = (cctx->blockState).matchState.window.dictLimit;
    if (src < pBVar7 + uVar22 && pBVar7 + (cctx->blockState).matchState.window.lowLimit < pBVar27) {
      uVar23 = (uint)((long)pBVar27 - (long)pBVar7);
      if ((long)(ulong)uVar22 < (long)pBVar27 - (long)pBVar7) {
        uVar23 = uVar22;
      }
      (cctx->blockState).matchState.window.lowLimit = uVar23;
    }
    if (bVar35 || pBVar6 != (BYTE *)src) {
      (cctx->blockState).matchState.forceNonContiguous = 0;
      (cctx->blockState).matchState.nextToUpdate = (cctx->blockState).matchState.window.dictLimit;
    }
    local_48 = sVar16;
    if ((cctx->appliedParams).ldmParams.enableLdm == ZSTD_ps_enable) {
      pBVar6 = (cctx->ldmState).window.base;
      if (pBVar6 == (BYTE *)0x0) goto LAB_001b88f5;
      if ((cctx->ldmState).window.dictBase == (BYTE *)0x0) goto LAB_001b8914;
      pBVar7 = (cctx->ldmState).window.nextSrc;
      if (pBVar7 != (BYTE *)src) {
        uVar25 = (long)pBVar7 - (long)pBVar6;
        UVar3 = (cctx->ldmState).window.dictLimit;
        (cctx->ldmState).window.lowLimit = UVar3;
        if (uVar25 >> 0x20 != 0) {
LAB_001b8952:
          __assert_fail("distanceFromBase == (size_t)(U32)distanceFromBase",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x4f2,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)")
          ;
        }
        UVar13 = (U32)uVar25;
        (cctx->ldmState).window.dictLimit = UVar13;
        (cctx->ldmState).window.dictBase = pBVar6;
        (cctx->ldmState).window.base = (BYTE *)((long)src - uVar25);
        if (UVar13 - UVar3 < 8) {
          (cctx->ldmState).window.lowLimit = UVar13;
        }
      }
      (cctx->ldmState).window.nextSrc = pBVar27;
      pBVar6 = (cctx->ldmState).window.dictBase;
      uVar22 = (cctx->ldmState).window.dictLimit;
      if (src < pBVar6 + uVar22 && pBVar6 + (cctx->ldmState).window.lowLimit < pBVar27) {
        uVar23 = (uint)((long)pBVar27 - (long)pBVar6);
        if ((long)(ulong)uVar22 < (long)pBVar27 - (long)pBVar6) {
          uVar23 = uVar22;
        }
        (cctx->ldmState).window.lowLimit = uVar23;
      }
    }
    if (frame == 0) {
      ZSTD_overflowCorrectIfNeeded(ms,&cctx->workspace,&cctx->appliedParams,src,pBVar27);
      local_110 = ZSTD_compressBlock_internal(cctx,dst,dstCapacity,src,srcSize,0);
    }
    else {
      uVar22 = (cctx->appliedParams).cParams.windowLog;
      iVar14 = 1 << ((byte)uVar22 & 0x1f);
      if (0x1f < uVar22) {
        __assert_fail("cctx->appliedParams.cParams.windowLog <= ZSTD_WINDOWLOG_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x1133,
                      "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                     );
      }
      local_120 = cctx->blockSize;
      if ((cctx->appliedParams).fParams.checksumFlag != 0) {
        ZSTD_XXH64_update(&cctx->xxhState,src,srcSize);
      }
      local_40 = &cctx->workspace;
      origSeqStore = &cctx->seqStore;
      pUVar1 = (cctx->blockSplitCtx).partitions;
      resultSeqStore = &(cctx->blockSplitCtx).nextSeqStore;
      resultSeqStore_00 = &(cctx->blockSplitCtx).currSeqStore;
      sVar16 = srcSize;
      op = (BYTE *)dst;
      do {
        if (sVar16 == 0) {
          if ((lastFrameChunk != 0) && (dst < op)) {
            cctx->stage = ZSTDcs_ending;
          }
          local_110 = (long)op - (long)dst;
          break;
        }
        uVar23 = 0;
        uVar22 = lastFrameChunk & 1;
        if (local_120 < sVar16) {
          uVar22 = uVar23;
        }
        if (dstCapacity < 6) {
          local_110 = 0xffffffffffffffba;
        }
        else {
          if (sVar16 < local_120) {
            local_120 = sVar16;
          }
          pBVar27 = (BYTE *)((long)src + local_120);
          ZSTD_overflowCorrectIfNeeded(ms,local_40,&cctx->appliedParams,src,pBVar27);
          iVar15 = (int)(cctx->blockState).matchState.window.base;
          uVar24 = (int)pBVar27 - iVar15;
          uVar23 = (cctx->blockState).matchState.loadedDictEnd;
          local_38 = pBVar27;
          if (uVar24 < uVar23) {
            __assert_fail("blockEndIdx >= loadedDictEnd",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x4ba,
                          "void ZSTD_checkDictValidity(const ZSTD_window_t *, const void *, U32, U32 *, const ZSTD_matchState_t **)"
                         );
          }
          if ((iVar14 + uVar23 < uVar24) ||
             (uVar23 != (cctx->blockState).matchState.window.dictLimit)) {
            (cctx->blockState).matchState.loadedDictEnd = 0;
            (cctx->blockState).matchState.dictMatchState = (ZSTD_matchState_t *)0x0;
          }
          uVar23 = (int)src - iVar15;
          if ((cctx->blockState).matchState.loadedDictEnd + iVar14 < uVar23) {
            uVar23 = uVar23 - iVar14;
            if ((cctx->blockState).matchState.window.lowLimit < uVar23) {
              (cctx->blockState).matchState.window.lowLimit = uVar23;
            }
            uVar23 = (cctx->blockState).matchState.window.lowLimit;
            if ((cctx->blockState).matchState.window.dictLimit < uVar23) {
              (cctx->blockState).matchState.window.dictLimit = uVar23;
            }
            (cctx->blockState).matchState.loadedDictEnd = 0;
            (cctx->blockState).matchState.dictMatchState = (ZSTD_matchState_t *)0x0;
          }
          uVar23 = (cctx->blockState).matchState.window.lowLimit;
          if ((cctx->blockState).matchState.nextToUpdate < uVar23) {
            (cctx->blockState).matchState.nextToUpdate = uVar23;
          }
          uVar10 = (ushort)uVar22;
          sVar21 = (short)local_120;
          if ((cctx->appliedParams).targetCBlockSize == 0) {
            ZVar4 = (cctx->appliedParams).useBlockSplitter;
            if (ZVar4 == ZSTD_ps_enable) {
              uVar25 = ZSTD_buildSeqStore(cctx,src,local_120);
              if (uVar25 < 0xffffffffffffff89) {
                if (uVar25 == 1) {
                  pZVar8 = (cctx->blockState).prevCBlock;
                  if ((pZVar8->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
                    (pZVar8->entropy).fse.offcode_repeatMode = FSE_repeat_check;
                  }
                  uVar25 = local_120 + 3;
                  if (dstCapacity < uVar25) {
                    uVar25 = 0xffffffffffffffba;
                  }
                  else {
                    *(ushort *)op = uVar10 + sVar21 * 8;
                    op[2] = (BYTE)(local_120 >> 0xd);
                    memcpy(op + 3,src,local_120);
                  }
                  goto LAB_001b841e;
                }
                pBVar27 = (BYTE *)((ulong)((long)(cctx->seqStore).sequences -
                                          (long)(cctx->seqStore).sequencesStart) >> 3);
                bVar35 = true;
              }
              else {
LAB_001b841e:
                bVar35 = false;
              }
              if (bVar35) {
                stack0xffffffffffffff18 = 0;
                if (4 < (uint)pBVar27) {
                  dRep.rep._0_8_ = pUVar1;
                  ZSTD_deriveBlockSplitsHelper
                            ((seqStoreSplits *)&dRep,0,(ulong)pBVar27 & 0xffffffff,cctx,origSeqStore
                            );
                  *(uint *)(dRep.rep._0_8_ + stack0xffffffffffffff18 * 4) = (uint)pBVar27;
                }
                uVar11 = stack0xffffffffffffff18;
                pZVar8 = (cctx->blockState).prevCBlock;
                stack0xffffffffffffff18 = CONCAT44(uStack_e4,pZVar8->rep[2]);
                dRep.rep._0_8_ = *(undefined8 *)pZVar8->rep;
                local_58.rep._0_8_ = *(undefined8 *)pZVar8->rep;
                local_58.rep[2] = pZVar8->rep[2];
                (cctx->blockSplitCtx).nextSeqStore.maxNbLit = 0;
                (cctx->blockSplitCtx).nextSeqStore.longLengthType = ZSTD_llt_none;
                (cctx->blockSplitCtx).nextSeqStore.longLengthPos = 0;
                (cctx->blockSplitCtx).nextSeqStore.ofCode = (BYTE *)0x0;
                (cctx->blockSplitCtx).nextSeqStore.maxNbSeq = 0;
                (cctx->blockSplitCtx).nextSeqStore.llCode = (BYTE *)0x0;
                (cctx->blockSplitCtx).nextSeqStore.mlCode = (BYTE *)0x0;
                (cctx->blockSplitCtx).nextSeqStore.litStart = (BYTE *)0x0;
                (cctx->blockSplitCtx).nextSeqStore.lit = (BYTE *)0x0;
                resultSeqStore->sequencesStart = (seqDef *)0x0;
                (cctx->blockSplitCtx).nextSeqStore.sequences = (seqDef *)0x0;
                if (uVar11 == 0) {
                  uVar25 = ZSTD_compressSeqStore_singleBlock
                                     (cctx,origSeqStore,&dRep,&local_58,op,dstCapacity,src,local_120
                                      ,uVar22,0);
                  if (uVar25 < 0xffffffffffffff89) {
                    if (0x20000 < cctx->blockSize) {
                      __assert_fail("zc->blockSize <= ZSTD_BLOCKSIZE_MAX",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                                    ,0x1034,
                                    "size_t ZSTD_compressBlock_splitBlock_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                                   );
                    }
                    if (cctx->blockSize + 3 < uVar25) {
                      __assert_fail("cSizeSingleBlock <= zc->blockSize + ZSTD_blockHeaderSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                                    ,0x1035,
                                    "size_t ZSTD_compressBlock_splitBlock_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                                   );
                    }
                  }
                }
                else {
                  ZSTD_deriveSeqStoreChunk(resultSeqStore_00,origSeqStore,0,(ulong)*pUVar1);
                  uVar34 = 0;
                  local_78 = op;
                  uVar28 = 0;
                  local_60 = 0;
                  uVar25 = sVar16;
                  local_70 = (BYTE *)src;
                  local_68 = dstCapacity;
                  do {
                    sVar17 = ZSTD_countSeqStoreLiteralsBytes(resultSeqStore_00);
                    psVar9 = (cctx->blockSplitCtx).currSeqStore.sequencesStart;
                    lVar26 = (long)(cctx->blockSplitCtx).currSeqStore.sequences - (long)psVar9;
                    if (lVar26 == 0) {
                      lVar33 = 0;
                    }
                    else {
                      lVar26 = lVar26 >> 3;
                      lVar33 = 0;
                      uVar30 = 0;
                      do {
                        lVar32 = lVar33 + (ulong)psVar9[uVar30].mlBase;
                        lVar33 = lVar32 + 3;
                        if (((cctx->blockSplitCtx).currSeqStore.longLengthPos == uVar30) &&
                           ((cctx->blockSplitCtx).currSeqStore.longLengthType ==
                            ZSTD_llt_matchLength)) {
                          lVar33 = lVar32 + 0x10003;
                        }
                        uVar30 = uVar30 + 1;
                      } while (lVar26 + (ulong)(lVar26 == 0) != uVar30);
                    }
                    sVar17 = lVar33 + sVar17;
                    local_60 = local_60 + sVar17;
                    if (uVar28 == uVar11) {
                      sVar17 = (sVar17 + local_120) - local_60;
                      uVar23 = uVar22;
                    }
                    else {
                      ZSTD_deriveSeqStoreChunk
                                (resultSeqStore,origSeqStore,(ulong)pUVar1[uVar28],
                                 (ulong)(cctx->blockSplitCtx).partitions[uVar28 + 1]);
                      uVar23 = 0;
                    }
                    sVar18 = ZSTD_compressSeqStore_singleBlock
                                       (cctx,resultSeqStore_00,&dRep,&local_58,local_78,local_68,
                                        local_70,sVar17,uVar23,1);
                    sVar12 = sVar18;
                    if (sVar18 < 0xffffffffffffff89) {
                      psVar29 = resultSeqStore;
                      psVar31 = resultSeqStore_00;
                      for (lVar26 = 10; lVar26 != 0; lVar26 = lVar26 + -1) {
                        psVar31->sequencesStart = psVar29->sequencesStart;
                        psVar29 = (seqStore_t *)((long)psVar29 + (ulong)bVar36 * -0x10 + 8);
                        psVar31 = (seqStore_t *)((long)psVar31 + (ulong)bVar36 * -0x10 + 8);
                      }
                      if (cctx->blockSize + 3 < sVar18) {
                        __assert_fail("cSizeChunk <= zc->blockSize + ZSTD_blockHeaderSize",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                                      ,0x1057,
                                      "size_t ZSTD_compressBlock_splitBlock_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                                     );
                      }
                      uVar34 = uVar34 + sVar18;
                      local_68 = local_68 - sVar18;
                      local_78 = local_78 + sVar18;
                      local_70 = local_70 + sVar17;
                      sVar12 = uVar25;
                    }
                    uVar25 = sVar12;
                    if (0xffffffffffffff88 < sVar18) goto LAB_001b8703;
                    uVar28 = uVar28 + 1;
                  } while (uVar28 <= uVar11);
                  pZVar8 = (cctx->blockState).prevCBlock;
                  pZVar8->rep[2] = dRep.rep[2];
                  *(undefined8 *)pZVar8->rep = dRep.rep._0_8_;
                  uVar25 = uVar34;
                }
              }
LAB_001b8703:
              if (uVar25 < 0xffffffffffffff89) {
                if (uVar25 == 0) {
                  if ((cctx->seqCollector).collectSequences != 1) {
                    __assert_fail("cSize > 0 || cctx->seqCollector.collectSequences == 1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                                  ,0x1155,
                                  "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                                 );
                  }
                  uVar25 = 0;
                }
                goto LAB_001b8732;
              }
            }
            else {
              if (ZVar4 == ZSTD_ps_auto) {
                __assert_fail("cctxParams->useBlockSplitter != ZSTD_ps_auto",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                              ,0xa7a,"int ZSTD_blockSplitterEnabled(ZSTD_CCtx_params *)");
              }
              uVar25 = ZSTD_compressBlock_internal(cctx,op + 3,dstCapacity - 3,src,local_120,1);
              if (uVar25 < 0xffffffffffffff89) {
                if (uVar25 == 1) {
                  sVar21 = 2;
                  sVar17 = local_120;
                }
                else {
                  if (uVar25 == 0) {
                    uVar25 = 0xffffffffffffffba;
                    if (local_120 + 3 <= dstCapacity) {
                      *(ushort *)op = uVar10 + sVar21 * 8;
                      op[2] = (BYTE)(local_120 >> 0xd);
                      memcpy(op + 3,src,local_120);
                      uVar25 = local_120 + 3;
                    }
                    if (0xffffffffffffff88 < uVar25) goto LAB_001b875c;
                    goto LAB_001b8732;
                  }
                  sVar21 = 4;
                  sVar17 = uVar25;
                }
                *(ushort *)op = sVar21 + (short)sVar17 * 8 | uVar10;
                op[2] = (BYTE)(sVar17 >> 0xd);
                uVar25 = uVar25 + 3;
                goto LAB_001b8732;
              }
            }
LAB_001b875c:
            local_110 = uVar25;
            uVar23 = 0;
          }
          else {
            uVar25 = ZSTD_buildSeqStore(cctx,src,local_120);
            if (uVar25 < 0xffffffffffffff89) {
              if (uVar25 == 0) {
                if ((((cctx->isFirstBlock == 0) &&
                     ((ulong)((long)(cctx->seqStore).sequences -
                             (long)(cctx->seqStore).sequencesStart) < 0x20)) &&
                    ((ulong)((long)(cctx->seqStore).lit - (long)(cctx->seqStore).litStart) < 10)) &&
                   (iVar15 = ZSTD_isRLE((BYTE *)src,local_120), iVar15 != 0)) {
                  BVar2 = *src;
                  *(ushort *)op = uVar10 + sVar21 * 8 + 2;
                  op[2] = (BYTE)(local_120 >> 0xd);
                  op[3] = BVar2;
                  uVar25 = 4;
                }
                else {
                  uVar25 = ZSTD_compressSuperBlock(cctx,op,dstCapacity,src,local_120,uVar22);
                  if (uVar25 == 0xffffffffffffffba) goto LAB_001b80d0;
                  ZVar5 = (cctx->appliedParams).cParams.strategy;
                  if (ZVar5 + ~ZSTD_btultra2 < 0xfffffff7) {
                    __assert_fail("ZSTD_cParam_withinBounds(ZSTD_c_strategy, (int)strat)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                                  ,600,"size_t ZSTD_minGain(size_t, ZSTD_strategy)");
                  }
                  if (uVar25 < 0xffffffffffffff89) {
                    bVar20 = (char)ZVar5 - 1;
                    if (ZVar5 < ZSTD_btultra) {
                      bVar20 = 6;
                    }
                    if ((uVar25 == 0) ||
                       ((local_120 - (local_120 >> (bVar20 & 0x3f))) + 1 <= uVar25))
                    goto LAB_001b80d0;
                    pZVar8 = (cctx->blockState).prevCBlock;
                    (cctx->blockState).prevCBlock = (cctx->blockState).nextCBlock;
                    (cctx->blockState).nextCBlock = pZVar8;
                  }
                }
              }
              else {
LAB_001b80d0:
                uVar25 = 0xffffffffffffffba;
                if (local_120 + 3 <= dstCapacity) {
                  *(ushort *)op = uVar10 + sVar21 * 8;
                  op[2] = (BYTE)(local_120 >> 0xd);
                  memcpy(op + 3,src,local_120);
                  uVar25 = local_120 + 3;
                }
              }
              if ((uVar25 < 0xffffffffffffff89) &&
                 (pZVar8 = (cctx->blockState).prevCBlock,
                 (pZVar8->entropy).fse.offcode_repeatMode == FSE_repeat_valid)) {
                (pZVar8->entropy).fse.offcode_repeatMode = FSE_repeat_check;
              }
            }
            if (0xffffffffffffff88 < uVar25) {
              uVar23 = 0;
              local_110 = uVar25;
              goto LAB_001b8768;
            }
            if (uVar25 == 0) {
              __assert_fail("cSize > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                            ,0x1150,
                            "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                           );
            }
            if (local_120 + 3 < uVar25) {
              __assert_fail("cSize <= blockSize + ZSTD_blockHeaderSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                            ,0x1151,
                            "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                           );
            }
LAB_001b8732:
            bVar35 = dstCapacity < uVar25;
            dstCapacity = dstCapacity - uVar25;
            if (bVar35) {
              __assert_fail("dstCapacity >= cSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                            ,0x116d,
                            "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                           );
            }
            op = op + uVar25;
            sVar16 = sVar16 - local_120;
            cctx->isFirstBlock = 0;
            uVar23 = 1;
            src = local_38;
          }
        }
LAB_001b8768:
      } while ((char)uVar23 != '\0');
    }
    if (local_110 < 0xffffffffffffff89) {
      uVar19 = srcSize + cctx->consumedSrcSize;
      cctx->consumedSrcSize = uVar19;
      sVar16 = local_110 + local_48;
      cctx->producedCSize = cctx->producedCSize + sVar16;
      if (((cctx->appliedParams).fParams.contentSizeFlag != 0) && (cctx->pledgedSrcSizePlusOne == 0)
         ) {
        __assert_fail("!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x120b,
                      "size_t ZSTD_compressContinue_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                     );
      }
      local_110 = 0xffffffffffffffb8;
      if (uVar19 + 1 <= cctx->pledgedSrcSizePlusOne) {
        local_110 = sVar16;
      }
      if (cctx->pledgedSrcSizePlusOne == 0) {
        local_110 = sVar16;
      }
    }
  }
  return local_110;
}

Assistant:

static size_t ZSTD_compressContinue_internal (ZSTD_CCtx* cctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize,
                               U32 frame, U32 lastFrameChunk)
{
    ZSTD_matchState_t* const ms = &cctx->blockState.matchState;
    size_t fhSize = 0;

    DEBUGLOG(5, "ZSTD_compressContinue_internal, stage: %u, srcSize: %u",
                cctx->stage, (unsigned)srcSize);
    RETURN_ERROR_IF(cctx->stage==ZSTDcs_created, stage_wrong,
                    "missing init (ZSTD_compressBegin)");

    if (frame && (cctx->stage==ZSTDcs_init)) {
        fhSize = ZSTD_writeFrameHeader(dst, dstCapacity, &cctx->appliedParams,
                                       cctx->pledgedSrcSizePlusOne-1, cctx->dictID);
        FORWARD_IF_ERROR(fhSize, "ZSTD_writeFrameHeader failed");
        assert(fhSize <= dstCapacity);
        dstCapacity -= fhSize;
        dst = (char*)dst + fhSize;
        cctx->stage = ZSTDcs_ongoing;
    }

    if (!srcSize) return fhSize;  /* do not generate an empty block if no input */

    if (!ZSTD_window_update(&ms->window, src, srcSize, ms->forceNonContiguous)) {
        ms->forceNonContiguous = 0;
        ms->nextToUpdate = ms->window.dictLimit;
    }
    if (cctx->appliedParams.ldmParams.enableLdm == ZSTD_ps_enable) {
        ZSTD_window_update(&cctx->ldmState.window, src, srcSize, /* forceNonContiguous */ 0);
    }

    if (!frame) {
        /* overflow check and correction for block mode */
        ZSTD_overflowCorrectIfNeeded(
            ms, &cctx->workspace, &cctx->appliedParams,
            src, (BYTE const*)src + srcSize);
    }

    DEBUGLOG(5, "ZSTD_compressContinue_internal (blockSize=%u)", (unsigned)cctx->blockSize);
    {   size_t const cSize = frame ?
                             ZSTD_compress_frameChunk (cctx, dst, dstCapacity, src, srcSize, lastFrameChunk) :
                             ZSTD_compressBlock_internal (cctx, dst, dstCapacity, src, srcSize, 0 /* frame */);
        FORWARD_IF_ERROR(cSize, "%s", frame ? "ZSTD_compress_frameChunk failed" : "ZSTD_compressBlock_internal failed");
        cctx->consumedSrcSize += srcSize;
        cctx->producedCSize += (cSize + fhSize);
        assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
        if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
            ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
            RETURN_ERROR_IF(
                cctx->consumedSrcSize+1 > cctx->pledgedSrcSizePlusOne,
                srcSize_wrong,
                "error : pledgedSrcSize = %u, while realSrcSize >= %u",
                (unsigned)cctx->pledgedSrcSizePlusOne-1,
                (unsigned)cctx->consumedSrcSize);
        }
        return cSize + fhSize;
    }
}